

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

map * map_new(size_t len)

{
  map *__ptr;
  atomic_uintptr_t *paVar1;
  
  __ptr = (map *)calloc(1,0x10);
  if (__ptr != (map *)0x0) {
    paVar1 = (atomic_uintptr_t *)mmap((void *)0x0,len * 8,3,0x4022,-1,0);
    __ptr->data = paVar1;
    if (paVar1 != (atomic_uintptr_t *)0xffffffffffffffff) {
      __ptr->len = len;
      return __ptr;
    }
    free(__ptr);
  }
  return (map *)0x0;
}

Assistant:

struct map *
map_new(size_t len)
{
    struct map *dst;

    dst = calloc(1, sizeof(struct map));
    if (dst == NULL)
        return (NULL);
#ifdef _WIN32
    dst->data = calloc(len, sizeof(dst->data[0]));
    if(dst->data == NULL) {
        dbg_perror("calloc()");
        free(dst);
        return NULL;
    }
    dst->len = len;
#else
    dst->data = mmap(NULL, len * sizeof(dst->data[0]), PROT_READ | PROT_WRITE,
            MAP_PRIVATE | MAP_NORESERVE | MAP_ANON, -1, 0);
    if (dst->data == MAP_FAILED) {
        dbg_perror("mmap(2)");
        free(dst);
        return (NULL);
    }
    dst->len = len;
#endif

    return (dst);
}